

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O1

void __thiscall
ON_SubDComponentParameter::ON_SubDComponentParameter
          (ON_SubDComponentParameter *this,ON_SubDComponentId face_id,ON_SubDFaceParameter fp)

{
  ON_SubDFaceCornerDex face_cdex;
  bool bVar1;
  uint face_id_00;
  uint uVar2;
  ON_2dPoint OVar3;
  ON_SubDComponentId local_40;
  anon_union_8_3_6bf0bb0e_for_m_p0 local_38;
  anon_union_8_3_7b68a318_for_m_p1 local_30;
  ON_SubDComponentId local_28;
  
  this->m_cid = ON_SubDComponentId::Unset;
  (this->m_p0).eptr_s = 0.0;
  (this->m_p1).f_corner_t = 0.0;
  local_40 = face_id;
  bVar1 = ON_SubDComponentId::IsFaceId(&local_40);
  if (bVar1) {
    bVar1 = Internal_Init(this,local_40);
    face_cdex = fp.m_cdex;
    if (bVar1) {
      if (0x2ffff < (uint)fp.m_cdex && fp.m_cdex.m_corner_index < fp.m_cdex.m_edge_count) {
        OVar3 = ON_SubDFaceParameter::FaceCornerParameters(&fp);
        local_30 = (anon_union_8_3_7b68a318_for_m_p1)OVar3.y;
        local_38 = (anon_union_8_3_6bf0bb0e_for_m_p0)OVar3.x;
        bVar1 = ON_2dPoint::IsValid((ON_2dPoint *)&local_38.v_active_e);
        if (bVar1) {
          face_id_00 = ON_SubDComponentId::FaceId(&local_40);
          uVar2 = ON_SubDComponentId::ComponentDirection(&local_40);
          ON_SubDComponentId::ON_SubDComponentId(&local_28,face_id_00,(ulong)uVar2,face_cdex);
          this->m_cid = local_28;
          this->m_p0 = local_38;
          this->m_p1 = local_30;
        }
      }
    }
  }
  return;
}

Assistant:

ON_SubDComponentParameter::ON_SubDComponentParameter(ON_SubDComponentId face_id, ON_SubDFaceParameter fp)
{
  if (face_id.IsFaceId() && Internal_Init(face_id))
  {
    const ON_SubDFaceCornerDex cdex = fp.FaceCornerDex();
    if (cdex.IsSet())
    {
      const ON_2dPoint p = fp.FaceCornerParameters();
      if (p.IsValid())
      {
        this->m_cid = ON_SubDComponentId(face_id.FaceId(), face_id.ComponentDirection(), cdex);
        this->m_p0.f_corner_s = p.x;
        this->m_p1.f_corner_t = p.y;
      }
    }
  }
}